

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O0

bool __thiscall QSQLiteDriver::subscribeToNotification(QSQLiteDriver *this,QString *name)

{
  bool bVar1;
  QSQLiteDriverPrivate *this_00;
  ulong uVar2;
  undefined8 uVar3;
  qsizetype qVar4;
  sqlite3 *in_RSI;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_RDI;
  long in_FS_OFFSET;
  QSQLiteDriverPrivate *d;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  undefined4 in_stack_ffffffffffffff68;
  CaseSensitivity in_stack_ffffffffffffff6c;
  bool local_69;
  char local_68 [32];
  char local_48 [32];
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QSQLiteDriver *)0x119b25);
  uVar2 = (**(code **)&((DataPointer *)&in_RDI->category)->d[6].super_QArrayData)();
  if ((uVar2 & 1) == 0) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    lcSqlite();
    anon_unknown.dwarf_2053b::QLoggingCategoryMacroHolder<(QtMsgType)1>::QLoggingCategoryMacroHolder
              (in_RDI,(QLoggingCategory *)
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    while( true ) {
      bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                        ((QLoggingCategoryMacroHolder *)&local_18);
      if (!bVar1) break;
      anon_unknown.dwarf_2053b::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x119b90);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_RSI,(char *)this_00,(int)((ulong)in_RDI >> 0x20),
                 (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                 (char *)0x119ba6);
      QMessageLogger::warning(local_48,"QSQLiteDriver::subscribeToNotification: Database not open.")
      ;
      local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
    }
    local_69 = false;
  }
  else {
    bVar1 = QListSpecialMethods<QString>::contains
                      ((QListSpecialMethods<QString> *)this_00,(QString *)in_RDI,
                       in_stack_ffffffffffffff6c);
    if (bVar1) {
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      lcSqlite();
      anon_unknown.dwarf_2053b::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder
                (in_RDI,(QLoggingCategory *)
                        CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      while( true ) {
        bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                          ((QLoggingCategoryMacroHolder *)&local_28);
        if (!bVar1) break;
        anon_unknown.dwarf_2053b::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x119c35);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_RSI,(char *)this_00,(int)((ulong)in_RDI >> 0x20),
                   (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   (char *)0x119c4b);
        QtPrivate::asString((QString *)in_RSI);
        uVar3 = QString::utf16();
        QMessageLogger::warning
                  (local_68,
                   "QSQLiteDriver::subscribeToNotification: Already subscribing to \'%ls\'.",uVar3);
        local_20 = (undefined1 *)((ulong)local_20 & 0xffffffffffffff00);
      }
      local_69 = false;
    }
    else {
      QList<QString>::operator<<
                ((QList<QString> *)in_RDI,
                 (parameter_type)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      qVar4 = QList<QString>::size(&this_00->notificationid);
      if (qVar4 == 1) {
        sqlite3_update_hook(in_RSI,(_func_void_void_ptr_int_char_ptr_char_ptr_sqlite_int64 *)this_00
                            ,in_RDI);
      }
      local_69 = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_69;
  }
  __stack_chk_fail();
}

Assistant:

bool QSQLiteDriver::subscribeToNotification(const QString &name)
{
    Q_D(QSQLiteDriver);
    if (!isOpen()) {
        qCWarning(lcSqlite, "QSQLiteDriver::subscribeToNotification: Database not open.");
        return false;
    }

    if (d->notificationid.contains(name)) {
        qCWarning(lcSqlite, "QSQLiteDriver::subscribeToNotification: Already subscribing to '%ls'.",
                  qUtf16Printable(name));
        return false;
    }

    //sqlite supports only one notification callback, so only the first is registered
    d->notificationid << name;
    if (d->notificationid.size() == 1)
        sqlite3_update_hook(d->access, &handle_sqlite_callback, reinterpret_cast<void *> (this));

    return true;
}